

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int growOpArray(Vdbe *v,int nOp)

{
  Parse *pPVar1;
  sqlite3 *db;
  int iVar2;
  long lVar3;
  Op *p;
  
  lVar3 = 0x2a;
  if ((long)v->nOpAlloc != 0) {
    lVar3 = (long)v->nOpAlloc * 2;
  }
  pPVar1 = v->pParse;
  db = pPVar1->db;
  if (db->aLimit[5] < lVar3) {
    sqlite3OomFault(db);
  }
  else {
    p = (Op *)sqlite3DbRealloc(db,v->aOp,lVar3 * 0x18);
    if (p != (Op *)0x0) {
      iVar2 = sqlite3DbMallocSize(pPVar1->db,p);
      pPVar1->szOpAlloc = iVar2;
      v->nOpAlloc = (int)((ulong)(long)iVar2 / 0x18);
      v->aOp = p;
      return 0;
    }
  }
  return 7;
}

Assistant:

static int growOpArray(Vdbe *v, int nOp){
  VdbeOp *pNew;
  Parse *p = v->pParse;

  /* The SQLITE_TEST_REALLOC_STRESS compile-time option is designed to force
  ** more frequent reallocs and hence provide more opportunities for 
  ** simulated OOM faults.  SQLITE_TEST_REALLOC_STRESS is generally used
  ** during testing only.  With SQLITE_TEST_REALLOC_STRESS grow the op array
  ** by the minimum* amount required until the size reaches 512.  Normal
  ** operation (without SQLITE_TEST_REALLOC_STRESS) is to double the current
  ** size of the op array or add 1KB of space, whichever is smaller. */
#ifdef SQLITE_TEST_REALLOC_STRESS
  sqlite3_int64 nNew = (v->nOpAlloc>=512 ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)v->nOpAlloc+nOp);
#else
  sqlite3_int64 nNew = (v->nOpAlloc ? 2*(sqlite3_int64)v->nOpAlloc
                        : (sqlite3_int64)(1024/sizeof(Op)));
  UNUSED_PARAMETER(nOp);
#endif

  /* Ensure that the size of a VDBE does not grow too large */
  if( nNew > p->db->aLimit[SQLITE_LIMIT_VDBE_OP] ){
    sqlite3OomFault(p->db);
    return SQLITE_NOMEM;
  }

  assert( nOp<=(1024/sizeof(Op)) );
  assert( nNew>=(v->nOpAlloc+nOp) );
  pNew = sqlite3DbRealloc(p->db, v->aOp, nNew*sizeof(Op));
  if( pNew ){
    p->szOpAlloc = sqlite3DbMallocSize(p->db, pNew);
    v->nOpAlloc = p->szOpAlloc/sizeof(Op);
    v->aOp = pNew;
  }
  return (pNew ? SQLITE_OK : SQLITE_NOMEM_BKPT);
}